

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseExtensions
          (Parser *this,DescriptorProto *message,LocationRecorder *extensions_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  int iVar2;
  Token *pTVar3;
  DescriptorProto_ExtensionRange *pDVar4;
  ExtensionRangeOptions *from;
  ExtensionRangeOptions *this_00;
  SourceCodeInfo_Location *pSVar5;
  SourceCodeInfo_Location *from_00;
  SourceCodeInfo_Location *dest;
  int local_170;
  int j;
  int i_1;
  int i;
  LocationRecorder location_1;
  LocationRecorder index_location;
  ExtensionRangeOptions *options;
  SourceCodeInfo info;
  undefined1 local_f8 [4];
  int range_number_index;
  LocationRecorder end_location_1;
  LocationRecorder end_location;
  undefined1 local_c0 [8];
  LocationRecorder start_location;
  Token start_token;
  int32_t local_68;
  int end;
  int start;
  DescriptorProto_ExtensionRange *local_58;
  ExtensionRange *range;
  LocationRecorder location;
  int old_range_size;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *extensions_location_local;
  DescriptorProto *message_local;
  Parser *this_local;
  
  bVar1 = Consume(this,"extensions");
  if (bVar1) {
    location.location_._4_4_ = DescriptorProto::extension_range_size(message);
    do {
      iVar2 = DescriptorProto::extension_range_size(message);
      LocationRecorder::LocationRecorder((LocationRecorder *)&range,extensions_location,iVar2);
      local_58 = DescriptorProto::add_extension_range(message);
      LocationRecorder::RecordLegacyLocation
                ((LocationRecorder *)&range,&local_58->super_Message,NUMBER);
      io::Tokenizer::Token::Token((Token *)&start_location.location_);
      LocationRecorder::LocationRecorder((LocationRecorder *)local_c0,(LocationRecorder *)&range,1);
      pTVar3 = io::Tokenizer::current(this->input_);
      io::Tokenizer::Token::operator=((Token *)&start_location.location_,pTVar3);
      bVar1 = ConsumeInteger(this,&local_68,"Expected field number range.");
      if (!bVar1) {
        this_local._7_1_ = 0;
      }
      bVar1 = !bVar1;
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_c0);
      if (!bVar1) {
        bVar1 = TryConsume(this,"to");
        if (bVar1) {
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)&end_location_1.location_,(LocationRecorder *)&range,2);
          bVar1 = TryConsume(this,"max");
          if (bVar1) {
            start_token._52_4_ = 0xfffffffe;
LAB_00634c15:
            bVar1 = false;
          }
          else {
            bVar1 = ConsumeInteger(this,(int *)&start_token.field_0x34,"Expected integer.");
            if (bVar1) goto LAB_00634c15;
            this_local._7_1_ = 0;
            bVar1 = true;
          }
          LocationRecorder::~LocationRecorder((LocationRecorder *)&end_location_1.location_);
          if (bVar1) goto LAB_00634cdd;
        }
        else {
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)local_f8,(LocationRecorder *)&range,2);
          LocationRecorder::StartAt((LocationRecorder *)local_f8,(Token *)&start_location.location_)
          ;
          LocationRecorder::EndAt((LocationRecorder *)local_f8,(Token *)&start_location.location_);
          start_token._52_4_ = local_68;
          LocationRecorder::~LocationRecorder((LocationRecorder *)local_f8);
        }
        start_token._52_4_ = start_token._52_4_ + 1;
        DescriptorProto_ExtensionRange::set_start(local_58,local_68);
        DescriptorProto_ExtensionRange::set_end(local_58,start_token._52_4_);
        bVar1 = false;
      }
LAB_00634cdd:
      io::Tokenizer::Token::~Token((Token *)&start_location.location_);
      LocationRecorder::~LocationRecorder((LocationRecorder *)&range);
      if (bVar1) goto LAB_0063518e;
      bVar1 = TryConsume(this,",");
    } while (bVar1);
    bVar1 = LookingAt(this,"[");
    if (bVar1) {
      info._44_4_ = LocationRecorder::CurrentPathSize(extensions_location);
      SourceCodeInfo::SourceCodeInfo((SourceCodeInfo *)&options);
      pDVar4 = DescriptorProto::mutable_extension_range(message,location.location_._4_4_);
      from = DescriptorProto_ExtensionRange::mutable_options(pDVar4);
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)&location_1.location_,extensions_location,0,
                 (SourceCodeInfo *)&options);
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)&i_1,(LocationRecorder *)&location_1.location_,3);
      bVar1 = Consume(this,"[");
      if (bVar1) {
        do {
          bVar1 = ParseOption(this,&from->super_Message,(LocationRecorder *)&i_1,containing_file,
                              OPTION_ASSIGNMENT);
          if (!bVar1) {
            this_local._7_1_ = 0;
            bVar1 = true;
            goto LAB_00634f0e;
          }
          bVar1 = TryConsume(this,",");
        } while (bVar1);
        bVar1 = Consume(this,"]");
        if (bVar1) {
          bVar1 = false;
        }
        else {
          this_local._7_1_ = 0;
          bVar1 = true;
        }
      }
      else {
        this_local._7_1_ = 0;
        bVar1 = true;
      }
LAB_00634f0e:
      LocationRecorder::~LocationRecorder((LocationRecorder *)&i_1);
      LocationRecorder::~LocationRecorder((LocationRecorder *)&location_1.location_);
      j = location.location_._4_4_;
      if (!bVar1) {
        while( true ) {
          j = j + 1;
          iVar2 = DescriptorProto::extension_range_size(message);
          if (iVar2 <= j) break;
          pDVar4 = DescriptorProto::mutable_extension_range(message,j);
          this_00 = DescriptorProto_ExtensionRange::mutable_options(pDVar4);
          ExtensionRangeOptions::CopyFrom(this_00,from);
        }
        for (local_170 = location.location_._4_4_;
            iVar2 = DescriptorProto::extension_range_size(message), local_170 < iVar2;
            local_170 = local_170 + 1) {
          for (dest._4_4_ = 0; iVar2 = SourceCodeInfo::location_size((SourceCodeInfo *)&options),
              dest._4_4_ < iVar2; dest._4_4_ = dest._4_4_ + 1) {
            pSVar5 = SourceCodeInfo::location((SourceCodeInfo *)&options,dest._4_4_);
            iVar2 = SourceCodeInfo_Location::path_size(pSVar5);
            if (iVar2 != info._44_4_ + 1) {
              pSVar5 = SourceCodeInfo::add_location(this->source_code_info_);
              from_00 = SourceCodeInfo::location((SourceCodeInfo *)&options,dest._4_4_);
              SourceCodeInfo_Location::operator=(pSVar5,from_00);
              SourceCodeInfo_Location::set_path(pSVar5,info._44_4_,local_170);
            }
          }
        }
        bVar1 = false;
      }
      SourceCodeInfo::~SourceCodeInfo((SourceCodeInfo *)&options);
      if (bVar1) goto LAB_0063518e;
    }
    bVar1 = ConsumeEndOfDeclaration(this,";",extensions_location);
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0063518e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseExtensions(DescriptorProto* message,
                             const LocationRecorder& extensions_location,
                             const FileDescriptorProto* containing_file) {
  // Parse the declaration.
  DO(Consume("extensions"));

  int old_range_size = message->extension_range_size();

  do {
    // Note that kExtensionRangeFieldNumber was already pushed by the parent.
    LocationRecorder location(extensions_location,
                              message->extension_range_size());

    DescriptorProto::ExtensionRange* range = message->add_extension_range();
    location.RecordLegacyLocation(range,
                                  DescriptorPool::ErrorCollector::NUMBER);

    int start, end;
    io::Tokenizer::Token start_token;

    {
      LocationRecorder start_location(
          location, DescriptorProto::ExtensionRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, "Expected field number range."));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
  } while (TryConsume(","));

  if (LookingAt("[")) {
    int range_number_index = extensions_location.CurrentPathSize();
    SourceCodeInfo info;

    // Parse extension range options in the first range.
    ExtensionRangeOptions* options =
        message->mutable_extension_range(old_range_size)->mutable_options();

    {
      LocationRecorder index_location(
          extensions_location, 0 /* we fill this in w/ actual index below */,
          &info);
      LocationRecorder location(
          index_location, DescriptorProto::ExtensionRange::kOptionsFieldNumber);
      DO(Consume("["));

      do {
        DO(ParseOption(options, location, containing_file, OPTION_ASSIGNMENT));
      } while (TryConsume(","));

      DO(Consume("]"));
    }

    // Then copy the extension range options to all of the other ranges we've
    // parsed.
    for (int i = old_range_size + 1; i < message->extension_range_size(); i++) {
      message->mutable_extension_range(i)->mutable_options()->CopyFrom(
          *options);
    }
    // and copy source locations to the other ranges, too
    for (int i = old_range_size; i < message->extension_range_size(); i++) {
      for (int j = 0; j < info.location_size(); j++) {
        if (info.location(j).path_size() == range_number_index + 1) {
          // this location's path is up to the extension range index, but
          // doesn't include options; so it's redundant with location above
          continue;
        }
        SourceCodeInfo_Location* dest = source_code_info_->add_location();
        *dest = info.location(j);
        dest->set_path(range_number_index, i);
      }
    }
  }

  DO(ConsumeEndOfDeclaration(";", &extensions_location));
  return true;
}